

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableSpiAnalyzer.cpp
# Opt level: O0

void __thiscall EnrichableSpiAnalyzer::Setup(EnrichableSpiAnalyzer *this)

{
  byte bVar1;
  element_type *peVar2;
  AnalyzerChannelData *pAVar3;
  Channel local_58 [16];
  Channel local_48 [32];
  Channel local_28 [23];
  undefined1 local_11;
  EnrichableSpiAnalyzer *pEStack_10;
  bool allow_last_trailing_clock_edge_to_fall_outside_enable;
  EnrichableSpiAnalyzer *this_local;
  
  local_11 = 0;
  pEStack_10 = this;
  peVar2 = std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
  if (peVar2->mDataValidEdge == LeadingEdge) {
    local_11 = 1;
  }
  peVar2 = std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
  if (peVar2->mClockInactiveState == BIT_LOW) {
    peVar2 = std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
    if (peVar2->mDataValidEdge == LeadingEdge) {
      this->mArrowMarker = UpArrow;
    }
    else {
      this->mArrowMarker = DownArrow;
    }
  }
  else {
    peVar2 = std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
    if (peVar2->mDataValidEdge == LeadingEdge) {
      this->mArrowMarker = DownArrow;
    }
    else {
      this->mArrowMarker = UpArrow;
    }
  }
  peVar2 = std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
  Channel::Channel(local_28,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  bVar1 = Channel::operator!=(&peVar2->mMosiChannel,local_28);
  Channel::~Channel(local_28);
  if ((bVar1 & 1) == 0) {
    this->mMosi = (AnalyzerChannelData *)0x0;
  }
  else {
    std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
    pAVar3 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
    this->mMosi = pAVar3;
  }
  peVar2 = std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
  Channel::Channel(local_48,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  bVar1 = Channel::operator!=(&peVar2->mMisoChannel,local_48);
  Channel::~Channel(local_48);
  if ((bVar1 & 1) == 0) {
    this->mMiso = (AnalyzerChannelData *)0x0;
  }
  else {
    std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
    pAVar3 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
    this->mMiso = pAVar3;
  }
  std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
  pAVar3 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mClock = pAVar3;
  peVar2 = std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
  Channel::Channel(local_58,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  bVar1 = Channel::operator!=(&peVar2->mEnableChannel,local_58);
  Channel::~Channel(local_58);
  if ((bVar1 & 1) == 0) {
    this->mEnable = (AnalyzerChannelData *)0x0;
  }
  else {
    std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
    pAVar3 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
    this->mEnable = pAVar3;
  }
  return;
}

Assistant:

void EnrichableSpiAnalyzer::Setup()
{
	bool allow_last_trailing_clock_edge_to_fall_outside_enable = false;
	if( mSettings->mDataValidEdge == AnalyzerEnums::LeadingEdge )
		allow_last_trailing_clock_edge_to_fall_outside_enable = true;

	if( mSettings->mClockInactiveState == BIT_LOW )
	{
		if( mSettings->mDataValidEdge == AnalyzerEnums::LeadingEdge )
			mArrowMarker = AnalyzerResults::UpArrow;
		else
			mArrowMarker = AnalyzerResults::DownArrow;

	}else
	{
		if( mSettings->mDataValidEdge == AnalyzerEnums::LeadingEdge )
			mArrowMarker = AnalyzerResults::DownArrow;
		else
			mArrowMarker = AnalyzerResults::UpArrow;
	}


	if( mSettings->mMosiChannel != UNDEFINED_CHANNEL )
		mMosi = GetAnalyzerChannelData( mSettings->mMosiChannel );
	else
		mMosi = NULL;

	if( mSettings->mMisoChannel != UNDEFINED_CHANNEL )
		mMiso = GetAnalyzerChannelData( mSettings->mMisoChannel );
	else
		mMiso = NULL;


	mClock = GetAnalyzerChannelData( mSettings->mClockChannel );

	if( mSettings->mEnableChannel != UNDEFINED_CHANNEL )
		mEnable = GetAnalyzerChannelData( mSettings->mEnableChannel );
	else
		mEnable = NULL;

}